

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O3

void yprc_notification(lys_ypr_ctx *pctx,lysc_node_notif *notif)

{
  uint16_t *puVar1;
  lysc_must *plVar2;
  lysc_node *node;
  lysc_ext_instance *plVar3;
  ulong uVar4;
  long lVar5;
  lysc_ext_instance *plVar6;
  ly_bool flag;
  ly_bool local_29;
  
  local_29 = '\0';
  uVar4 = 0;
  if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
      (undefined1  [24])0x0) {
    uVar4 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
  }
  lVar5 = 0;
  ly_print_((pctx->field_0).field_0.out,"%*snotification %s",uVar4,"",(notif->field_0).node.name);
  puVar1 = &(pctx->field_0).field_0.level;
  *puVar1 = *puVar1 + 1;
  yprc_extension_instances(pctx,LY_STMT_NOTIFICATION,'\0',(notif->field_0).node.exts,&local_29);
  plVar6 = (lysc_ext_instance *)0x0;
  while( true ) {
    plVar2 = notif->musts;
    if (plVar2 == (lysc_must *)0x0) {
      plVar3 = (lysc_ext_instance *)0x0;
    }
    else {
      plVar3 = plVar2[-1].exts;
    }
    if (plVar3 <= plVar6) break;
    yprc_must(pctx,(lysc_must *)((long)&plVar2->cond + lVar5),&local_29);
    plVar6 = (lysc_ext_instance *)((long)&plVar6->def + 1);
    lVar5 = lVar5 + 0x38;
  }
  ypr_status(pctx,(notif->field_0).node.flags,(notif->field_0).node.exts,&local_29);
  ypr_description(pctx,(notif->field_0).node.dsc,(notif->field_0).node.exts,&local_29);
  ypr_reference(pctx,(notif->field_0).node.ref,(notif->field_0).node.exts,&local_29);
  if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x1000000000) ==
      (undefined1  [24])0x0) {
    for (node = notif->child; node != (lysc_node *)0x0; node = node->next) {
      if (local_29 == '\0') {
        local_29 = '\x01';
        ly_print_((pctx->field_0).field_0.out," {\n");
      }
      yprc_node(pctx,node);
    }
  }
  puVar1 = &(pctx->field_0).field_0.level;
  *puVar1 = *puVar1 - 1;
  ypr_close(pctx,local_29);
  return;
}

Assistant:

static void
yprc_notification(struct lys_ypr_ctx *pctx, const struct lysc_node_notif *notif)
{
    LY_ARRAY_COUNT_TYPE u;
    ly_bool flag = 0;
    struct lysc_node *data;

    ly_print_(pctx->out, "%*snotification %s", INDENT, notif->name);

    LEVEL++;
    yprc_extension_instances(pctx, LY_STMT_NOTIFICATION, 0, notif->exts, &flag);

    LY_ARRAY_FOR(notif->musts, u) {
        yprc_must(pctx, &notif->musts[u], &flag);
    }
    ypr_status(pctx, notif->flags, notif->exts, &flag);
    ypr_description(pctx, notif->dsc, notif->exts, &flag);
    ypr_reference(pctx, notif->ref, notif->exts, &flag);

    if (!(pctx->options & LYS_PRINT_NO_SUBSTMT)) {
        LY_LIST_FOR(notif->child, data) {
            ypr_open(pctx->out, &flag);
            yprc_node(pctx, data);
        }
    }

    LEVEL--;
    ypr_close(pctx, flag);
}